

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O1

int X509_LOOKUP_ctrl(X509_LOOKUP *ctx,int cmd,char *argc,long argl,char **ret)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  if (*(long *)ctx == 0) {
    return -1;
  }
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)ctx + 0x10);
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)();
    return iVar1;
  }
  return 1;
}

Assistant:

int X509_LOOKUP_ctrl(X509_LOOKUP *ctx, int cmd, const char *argc, long argl,
                     char **ret) {
  if (ctx->method == NULL) {
    return -1;
  }
  if (ctx->method->ctrl != NULL) {
    return ctx->method->ctrl(ctx, cmd, argc, argl, ret);
  } else {
    return 1;
  }
}